

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O0

xml_attribute __thiscall
pugi::xml_node::find_attribute<NULLCPugiXML::predicate_nullc_attribute>
          (xml_node *this,predicate_nullc_attribute pred)

{
  bool bVar1;
  unspecified_bool_type p_Var2;
  xml_node *this_local;
  undefined1 local_1c [8];
  predicate_nullc_attribute pred_local;
  xml_attribute attrib;
  
  pred_local.callback.context._0_4_ = pred.callback.id;
  local_1c = (undefined1  [8])pred.callback.context;
  if (this->_root == (xml_node_struct *)0x0) {
    xml_attribute::xml_attribute((xml_attribute *)((long)&pred_local.callback.context + 4));
  }
  else {
    pred_local.callback._4_8_ = first_attribute(this);
    while (p_Var2 = xml_attribute::operator_cast_to_function_pointer
                              ((xml_attribute *)((long)&pred_local.callback.context + 4)),
          p_Var2 != (unspecified_bool_type)0x0) {
      bVar1 = NULLCPugiXML::predicate_nullc_attribute::operator()
                        ((predicate_nullc_attribute *)local_1c,
                         (xml_attribute *)((long)&pred_local.callback.context + 4));
      if (bVar1) {
        return (xml_attribute)(xml_attribute_struct *)pred_local.callback._4_8_;
      }
      pred_local.callback._4_8_ =
           xml_attribute::next_attribute((xml_attribute *)((long)&pred_local.callback.context + 4));
    }
    xml_attribute::xml_attribute((xml_attribute *)((long)&pred_local.callback.context + 4));
  }
  return (xml_attribute)(xml_attribute_struct *)pred_local.callback._4_8_;
}

Assistant:

xml_attribute find_attribute(Predicate pred) const
		{
			if (!_root) return xml_attribute();

			for (xml_attribute attrib = first_attribute(); attrib; attrib = attrib.next_attribute())
				if (pred(attrib))
					return attrib;

			return xml_attribute();
		}